

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

void duckdb::TrimPathFunction<true>(DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_67f50693_for_value *paVar2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  reference this_00;
  ValidityMask *pVVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ValidityMask *pVVar9;
  ValidityMask *pVVar10;
  undefined1 in_R9B;
  idx_t idx_in_entry;
  ValidityMask *pVVar11;
  data_ptr_t pdVar12;
  string_t sVar13;
  anon_struct_16_3_d7536bce_for_pointer aVar14;
  string_t a;
  string_t a_00;
  string_t b;
  string_t b_00;
  UnifiedVectorFormat adata;
  Vector trim_extension;
  UnifiedVectorFormat bdata;
  Vector separator;
  ValidityMask *mask;
  idx_t in_stack_fffffffffffffdf0;
  SelectionVector *pSVar15;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  buffer_ptr<ValidityBuffer> *local_1f0;
  SelectionVector *local_1e8;
  idx_t local_1e0;
  UnifiedVectorFormat local_1d8;
  Vector local_190;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  sVar13.value.pointer.ptr = "ESaISt4pairIKSB_SD_EEEbSB_";
  sVar13.value._0_8_ = 0x6166656400000007;
  Value::Value((Value *)&local_190,sVar13);
  Vector::Vector(&local_98,(Value *)&local_190);
  Value::~Value((Value *)&local_190);
  Value::BOOLEAN((Value *)&local_1d8,false);
  Vector::Vector(&local_190,(Value *)&local_1d8);
  Value::~Value((Value *)&local_1d8);
  ReadOptionalArgs(args,&local_98,&local_190,(bool *)&DAT_00000001);
  mask = (ValidityMask *)args->count;
  if (((this_00->vector_type == CONSTANT_VECTOR) && (local_98.vector_type == CONSTANT_VECTOR)) &&
     (local_190.vector_type == CONSTANT_VECTOR)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar1 = (this_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
        ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 ||
         ((*local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))))
       && ((local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 ||
           ((*local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)
           ))) {
      paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
      aVar14 = (anon_struct_16_3_d7536bce_for_pointer)
               TernaryLambdaWrapper::
               Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)this_00->data)->pointer,
                          (string_t)*(anon_struct_16_3_d7536bce_for_pointer *)local_98.data,
                          (bool)in_R9B,mask,in_stack_fffffffffffffdf0);
      paVar2->pointer = aVar14;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_1d8);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(this_00,(idx_t)mask,&local_1d8);
    Vector::ToUnifiedFormat(&local_98,(idx_t)mask,&local_128);
    Vector::ToUnifiedFormat(&local_190,(idx_t)mask,&local_e0);
    pdVar12 = result->data;
    local_1e8 = local_e0.sel;
    FlatVector::VerifyFlatVector(result);
    if (((local_1d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) &&
        (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0)) &&
       (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0)) {
      if (mask != (ValidityMask *)0x0) {
        pdVar12 = pdVar12 + 8;
        pVVar11 = (ValidityMask *)0x0;
        pSVar15 = local_1d8.sel;
        do {
          pVVar6 = pVVar11;
          if (pSVar15->sel_vector != (sel_t *)0x0) {
            pVVar6 = (ValidityMask *)(ulong)pSVar15->sel_vector[(long)pVVar11];
          }
          pVVar10 = pVVar11;
          if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
            pVVar10 = (ValidityMask *)(ulong)(local_128.sel)->sel_vector[(long)pVVar11];
          }
          a.value.pointer.ptr = (char *)*(undefined8 *)(local_1d8.data + (long)pVVar6 * 0x10 + 8);
          a.value._0_8_ = *(undefined8 *)(local_1d8.data + (long)pVVar6 * 0x10);
          b.value.pointer.ptr = (char *)*(undefined8 *)(local_128.data + (long)pVVar10 * 0x10 + 8);
          b.value._0_8_ = *(undefined8 *)(local_128.data + (long)pVVar10 * 0x10);
          sVar13 = TernaryLambdaWrapper::
                   Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,a,b,(bool)in_R9B,mask,(idx_t)pSVar15);
          *(long *)(pdVar12 + -8) = sVar13.value._0_8_;
          *(long *)pdVar12 = sVar13.value._8_8_;
          pVVar11 = (ValidityMask *)
                    ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
          ;
          pdVar12 = pdVar12 + 0x10;
        } while (mask != pVVar11);
      }
    }
    else if (mask != (ValidityMask *)0x0) {
      local_1f0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar12 = pdVar12 + 8;
      pVVar11 = (ValidityMask *)0x0;
      pSVar15 = local_1d8.sel;
      do {
        pVVar6 = pVVar11;
        if (pSVar15->sel_vector != (sel_t *)0x0) {
          pVVar6 = (ValidityMask *)(ulong)pSVar15->sel_vector[(long)pVVar11];
        }
        pVVar10 = pVVar11;
        if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
          pVVar10 = (ValidityMask *)(ulong)(local_128.sel)->sel_vector[(long)pVVar11];
        }
        pVVar9 = pVVar11;
        if (local_1e8->sel_vector != (sel_t *)0x0) {
          pVVar9 = (ValidityMask *)(ulong)local_1e8->sel_vector[(long)pVVar11];
        }
        if (((local_1d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_1d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [(ulong)pVVar6 >> 6] >> ((ulong)pVVar6 & 0x3f) & 1) != 0)) &&
           (((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [(ulong)pVVar10 >> 6] >> ((ulong)pVVar10 & 0x3f) & 1) != 0)) &&
            ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 ||
             ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [(ulong)pVVar9 >> 6] >> ((ulong)pVVar9 & 0x3f) & 1) != 0)))))) {
          a_00.value.pointer.ptr = (char *)*(undefined8 *)(local_1d8.data + (long)pVVar6 * 0x10 + 8)
          ;
          a_00.value._0_8_ = *(undefined8 *)(local_1d8.data + (long)pVVar6 * 0x10);
          b_00.value.pointer.ptr =
               (char *)*(undefined8 *)(local_128.data + (long)pVVar10 * 0x10 + 8);
          b_00.value._0_8_ = *(undefined8 *)(local_128.data + (long)pVVar10 * 0x10);
          sVar13 = TernaryLambdaWrapper::
                   Operation<duckdb::TrimPathFunction<true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t&,duckdb::string_t,bool)_1_,duckdb::string_t,duckdb::string_t,bool,duckdb::string_t>
                             ((anon_class_8_1_6971b95b)result,a_00,b_00,(bool)in_R9B,mask,
                              (idx_t)pSVar15);
          *(long *)(pdVar12 + -8) = sVar13.value._0_8_;
          *(long *)pdVar12 = sVar13.value._8_8_;
        }
        else {
          _Var8._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var8._M_head_impl == (unsigned_long *)0x0) {
            local_1e0 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_208,&local_1e0);
            p_Var5 = p_Stack_200;
            peVar4 = local_208;
            local_208 = (element_type *)0x0;
            p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_200);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_1f0);
            _Var8._M_head_impl =
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var8._M_head_impl;
          }
          bVar3 = (byte)pVVar11 & 0x3f;
          _Var8._M_head_impl[(ulong)pVVar11 >> 6] =
               _Var8._M_head_impl[(ulong)pVVar11 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        pVVar11 = (ValidityMask *)
                  ((long)&(pVVar11->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1);
        pdVar12 = pdVar12 + 0x10;
      } while (mask != pVVar11);
    }
    if (local_e0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_128.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_1d8.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_190.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_190.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_190.type);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return;
}

Assistant:

static void TrimPathFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// set default values
	Vector &path = args.data[0];
	Vector separator(string_t("default"));
	Vector trim_extension(Value::BOOLEAN(false));
	ReadOptionalArgs(args, separator, trim_extension, FRONT_TRIM);

	TernaryExecutor::Execute<string_t, string_t, bool, string_t>(
	    path, separator, trim_extension, result, args.size(),
	    [&](string_t &inputs, string_t input_sep, bool trim_extension) {
		    auto data = inputs.GetData();
		    auto input_size = inputs.GetSize();
		    auto sep = GetSeparator(input_sep.GetString());

		    // find the beginning idx and the size of the result string
		    idx_t begin = 0;
		    idx_t new_size = input_size;
		    if (FRONT_TRIM) { // left trim
			    auto pos = Find(data, input_size, sep);
			    if (pos == 0) { // path starts with separator
				    pos = 1;
			    }
			    new_size = (IsIdxValid(pos, input_size)) ? pos : 0;
		    } else { // right trim
			    auto idx_last_sep = FindLast(data, input_size, sep);
			    if (IsIdxValid(idx_last_sep, input_size)) {
				    begin = idx_last_sep + 1;
			    }
			    if (trim_extension) {
				    auto idx_extension_sep = FindLast(data, input_size, ".");
				    if (begin <= idx_extension_sep && IsIdxValid(idx_extension_sep, input_size)) {
					    new_size = idx_extension_sep;
				    }
			    }
		    }
		    // copy the trimmed string
		    D_ASSERT(begin <= new_size);
		    auto target = StringVector::EmptyString(result, new_size - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, new_size - begin);

		    target.Finalize();
		    return target;
	    });
}